

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O1

void __thiscall
QArrayDataPointer<const_QtPrivate::QMetaTypeInterface_*>::relocate
          (QArrayDataPointer<const_QtPrivate::QMetaTypeInterface_*> *this,qsizetype offset,
          QMetaTypeInterface ***data)

{
  QMetaTypeInterface **d_first;
  QMetaTypeInterface **ppQVar1;
  
  d_first = this->ptr + offset;
  QtPrivate::q_relocate_overlap_n<QtPrivate::QMetaTypeInterface_const*,long_long>
            (this->ptr,this->size,d_first);
  if (data != (QMetaTypeInterface ***)0x0) {
    ppQVar1 = *data;
    if ((this->ptr <= ppQVar1) && (ppQVar1 < this->ptr + this->size)) {
      *data = ppQVar1 + offset;
    }
  }
  this->ptr = d_first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }